

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

void __thiscall
Imf_3_4::ChannelList::channelsInLayer
          (ChannelList *this,string *layerName,ConstIterator *first,ConstIterator *last)

{
  ConstIterator *in_RDI;
  ConstIterator *in_stack_ffffffffffffff98;
  string *prefix;
  undefined7 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [2];
  
  prefix = local_40;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
  channelsWithPrefix((ChannelList *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     prefix,in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
ChannelList::channelsInLayer (
    const string& layerName, ConstIterator& first, ConstIterator& last) const
{
    channelsWithPrefix (layerName + '.', first, last);
}